

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O1

_Bool wc_unescape(char *output,char *wildcard)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  
  bVar1 = *wildcard;
  do {
    bVar2 = bVar1 == 0;
    if (bVar2) {
      if ((byte *)output != (byte *)0x0) {
        *output = 0;
      }
      return bVar2;
    }
    uVar3 = bVar1 - 0x2a;
    if (uVar3 < 0x34) {
      if ((ulong)uVar3 != 0x32) {
        if ((0xa000000200001U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
          return bVar2;
        }
        goto LAB_0016ee0f;
      }
      if (((byte *)wildcard)[1] == 0) goto LAB_0016ee1d;
      if ((byte *)output == (byte *)0x0) {
        output = (char *)0x0;
      }
      else {
        *output = ((byte *)wildcard)[1];
        output = (char *)((byte *)output + 1);
      }
      wildcard = (char *)((byte *)wildcard + 2);
    }
    else {
LAB_0016ee0f:
      if ((byte *)output == (byte *)0x0) {
        output = (char *)0x0;
      }
      else {
        *output = bVar1;
        output = (char *)((byte *)output + 1);
      }
LAB_0016ee1d:
      wildcard = (char *)((byte *)wildcard + 1);
    }
    bVar1 = *wildcard;
  } while( true );
}

Assistant:

bool wc_unescape(char *output, const char *wildcard)
{
    while (*wildcard) {
        if (*wildcard == '\\') {
            wildcard++;
            /* We are lenient about trailing backslashes in non-wildcards. */
            if (*wildcard) {
                if (output)
                    *output++ = *wildcard;
                wildcard++;
            }
        } else if (*wildcard == '*' || *wildcard == '?' ||
                   *wildcard == '[' || *wildcard == ']') {
            return false;              /* it's a wildcard! */
        } else {
            if (output)
                *output++ = *wildcard;
            wildcard++;
        }
    }
    if (output)
        *output = '\0';
    return true;                       /* it's clean */
}